

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O0

void __thiscall
capnp::writeMessage(capnp *this,OutputStream *output,
                   ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments)

{
  Fault FVar1;
  size_t sVar2;
  kj *pkVar3;
  DirectWireValue<unsigned_int> *pDVar4;
  ArrayPtr<const_capnp::word> *pAVar5;
  ArrayPtr<const_unsigned_char> *pAVar6;
  size_t size;
  size_t size_00;
  ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> AVar7;
  ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> AVar8;
  ArrayPtr<const_unsigned_char> AVar9;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> AVar10;
  ArrayPtr<const_unsigned_char> *local_1f8;
  uint local_154;
  undefined1 auStack_150 [4];
  uint i_1;
  size_t local_148;
  ArrayPtr<const_unsigned_char> local_140;
  undefined1 local_130 [8];
  ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> pieces;
  Array<kj::ArrayPtr<const_unsigned_char>_> pieces_heap;
  ArrayPtr<const_unsigned_char> pieces_stack [4];
  bool pieces_isOnStack;
  size_t pieces_size;
  undefined1 auStack_b0 [4];
  uint i;
  ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> table;
  Array<capnp::_::DirectWireValue<unsigned_int>_> table_heap;
  WireValue<uint32_t>_conflict table_stack [16];
  bool table_isOnStack;
  size_t table_size;
  Fault local_28;
  Fault f;
  OutputStream *output_local;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_local;
  
  segments_local.ptr = segments.ptr;
  f.exception = (Exception *)this;
  output_local = output;
  sVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&output_local);
  if (sVar2 == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
               ,0x11a,FAILED,"segments.size() > 0","\"Tried to serialize uninitialized message.\"",
               (char (*) [42])"Tried to serialize uninitialized message.");
    kj::_::Debug::Fault::fatal(&local_28);
  }
  sVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&output_local);
  pkVar3 = (kj *)(sVar2 + 2 & 0xfffffffffffffffe);
  if (pkVar3 < (kj *)0x11) {
    kj::Array<capnp::_::DirectWireValue<unsigned_int>_>::Array
              ((Array<capnp::_::DirectWireValue<unsigned_int>_> *)&table.size_,(void *)0x0);
    AVar7 = kj::arrayPtr<capnp::_::DirectWireValue<unsigned_int>>
                      ((DirectWireValue<unsigned_int> *)&table_heap.disposer,(size_t)pkVar3);
  }
  else {
    kj::heapArray<capnp::_::DirectWireValue<unsigned_int>>
              ((Array<capnp::_::DirectWireValue<unsigned_int>_> *)&table.size_,pkVar3,size);
    AVar7 = kj::Array::operator_cast_to_ArrayPtr((Array *)&table.size_);
  }
  table.ptr = (DirectWireValue<unsigned_int> *)AVar7.size_;
  _auStack_b0 = AVar7.ptr;
  pDVar4 = kj::ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_>::operator[]
                     ((ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> *)auStack_b0,0);
  sVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&output_local);
  _::DirectWireValue<unsigned_int>::set(pDVar4,(int)sVar2 - 1);
  for (pieces_size._4_4_ = 0;
      sVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&output_local),
      pieces_size._4_4_ < sVar2; pieces_size._4_4_ = pieces_size._4_4_ + 1) {
    pDVar4 = kj::ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_>::operator[]
                       ((ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> *)auStack_b0,
                        (ulong)(pieces_size._4_4_ + 1));
    pAVar5 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                       ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&output_local,
                        (ulong)pieces_size._4_4_);
    sVar2 = kj::ArrayPtr<const_capnp::word>::size(pAVar5);
    _::DirectWireValue<unsigned_int>::set(pDVar4,(uint)sVar2);
  }
  sVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&output_local);
  if ((sVar2 & 1) == 0) {
    sVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&output_local);
    pDVar4 = kj::ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_>::operator[]
                       ((ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> *)auStack_b0,sVar2 + 1);
    _::DirectWireValue<unsigned_int>::set(pDVar4,0);
  }
  sVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&output_local);
  pkVar3 = (kj *)(sVar2 + 1);
  pieces_stack[3].size_._7_1_ = pkVar3 < (kj *)0x5;
  local_1f8 = (ArrayPtr<const_unsigned_char> *)&pieces_heap.disposer;
  do {
    kj::ArrayPtr<const_unsigned_char>::ArrayPtr(local_1f8);
    local_1f8 = local_1f8 + 1;
  } while (local_1f8 != (ArrayPtr<const_unsigned_char> *)&pieces_stack[3].size_);
  if ((pieces_stack[3].size_._7_1_ & 1) == 0) {
    kj::heapArray<kj::ArrayPtr<unsigned_char_const>>
              ((Array<kj::ArrayPtr<const_unsigned_char>_> *)&pieces.size_,pkVar3,size_00);
  }
  else {
    kj::Array<kj::ArrayPtr<const_unsigned_char>_>::Array
              ((Array<kj::ArrayPtr<const_unsigned_char>_> *)&pieces.size_,(void *)0x0);
  }
  if ((pieces_stack[3].size_._7_1_ & 1) == 0) {
    AVar8 = kj::Array::operator_cast_to_ArrayPtr((Array *)&pieces.size_);
  }
  else {
    AVar8 = kj::arrayPtr<kj::ArrayPtr<unsigned_char_const>>
                      ((ArrayPtr<const_unsigned_char> *)&pieces_heap.disposer,(size_t)pkVar3);
  }
  pieces.ptr = (ArrayPtr<const_unsigned_char> *)AVar8.size_;
  local_130 = (undefined1  [8])AVar8.ptr;
  _auStack_150 = kj::ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_>::asBytes
                           ((ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> *)auStack_b0);
  local_140 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)auStack_150);
  pAVar6 = kj::ArrayPtr<kj::ArrayPtr<const_unsigned_char>_>::operator[]
                     ((ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> *)local_130,0);
  *pAVar6 = local_140;
  local_154 = 0;
  while( true ) {
    sVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&output_local);
    FVar1 = f;
    if (sVar2 <= local_154) break;
    pAVar5 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                       ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&output_local,
                        (ulong)local_154);
    AVar9 = kj::ArrayPtr<const_capnp::word>::asBytes(pAVar5);
    pAVar6 = kj::ArrayPtr<kj::ArrayPtr<const_unsigned_char>_>::operator[]
                       ((ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> *)local_130,
                        (ulong)(local_154 + 1));
    *pAVar6 = AVar9;
    local_154 = local_154 + 1;
  }
  AVar10 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)local_130);
  (**(code **)(((FVar1.exception)->ownFile).content.ptr + 0x18))
            (FVar1.exception,AVar10.ptr,AVar10.size_);
  kj::Array<kj::ArrayPtr<const_unsigned_char>_>::~Array
            ((Array<kj::ArrayPtr<const_unsigned_char>_> *)&pieces.size_);
  kj::Array<capnp::_::DirectWireValue<unsigned_int>_>::~Array
            ((Array<capnp::_::DirectWireValue<unsigned_int>_> *)&table.size_);
  return;
}

Assistant:

void writeMessage(kj::OutputStream& output, kj::ArrayPtr<const kj::ArrayPtr<const word>> segments) {
  KJ_REQUIRE(segments.size() > 0, "Tried to serialize uninitialized message.");

  KJ_STACK_ARRAY(_::WireValue<uint32_t>, table, (segments.size() + 2) & ~size_t(1), 16, 64);

  // We write the segment count - 1 because this makes the first word zero for single-segment
  // messages, improving compression.  We don't bother doing this with segment sizes because
  // one-word segments are rare anyway.
  table[0].set(segments.size() - 1);
  for (uint i = 0; i < segments.size(); i++) {
    table[i + 1].set(segments[i].size());
  }
  if (segments.size() % 2 == 0) {
    // Set padding byte.
    table[segments.size() + 1].set(0);
  }

  KJ_STACK_ARRAY(kj::ArrayPtr<const byte>, pieces, segments.size() + 1, 4, 32);
  pieces[0] = table.asBytes();

  for (uint i = 0; i < segments.size(); i++) {
    pieces[i + 1] = segments[i].asBytes();
  }

  output.write(pieces);
}